

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControl::setFocusToNextOrPreviousAnchor(QWidgetTextControl *this,bool next)

{
  bool bVar1;
  QWidgetTextControlPrivate *this_00;
  ulong uVar2;
  byte in_SIL;
  QTextCursor *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *d;
  QTextCursor newAnchor;
  QRectF crect;
  undefined4 in_stack_ffffffffffffff68;
  TextInteractionFlag in_stack_ffffffffffffff6c;
  bool local_61;
  QTextCursor *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffbf;
  QTextCursor *startCursor;
  QWidgetTextControl *in_stack_ffffffffffffffc8;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidgetTextControl *)0x71f719);
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_RDI,in_stack_ffffffffffffff6c);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_c);
  if (bVar1) {
    local_61 = false;
  }
  else {
    selectionRect((QWidgetTextControl *)this_00);
    updateRequest((QWidgetTextControl *)in_RDI,
                  (QRectF *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    uVar2 = QTextCursor::hasSelection();
    if ((uVar2 & 1) == 0) {
      QTextCursor::QTextCursor((QTextCursor *)&stack0xffffffffffffffc8,this_00->doc);
      QTextCursor::operator=
                (in_RDI,(QTextCursor *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                );
      QTextCursor::~QTextCursor((QTextCursor *)&stack0xffffffffffffffc8);
      if ((in_SIL & 1) == 0) {
        QTextCursor::movePosition((int)this_00 + 0x88,0xb,0);
      }
      else {
        QTextCursor::movePosition((int)this_00 + 0x88,KeepAnchor,0);
      }
    }
    startCursor = (QTextCursor *)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&stack0xffffffffffffffc0);
    bVar1 = findNextPrevAnchor(in_stack_ffffffffffffffc8,startCursor,(bool)in_stack_ffffffffffffffbf
                               ,in_stack_ffffffffffffffb0);
    if (bVar1) {
      QTextCursor::operator=(&this_00->cursor,(QTextCursor *)&stack0xffffffffffffffc0);
      this_00->cursorIsFocusIndicator = true;
    }
    else {
      QTextCursor::clearSelection();
    }
    uVar2 = QTextCursor::hasSelection();
    local_61 = (uVar2 & 1) != 0;
    if (local_61) {
      selectionRect((QWidgetTextControl *)this_00);
      updateRequest((QWidgetTextControl *)in_RDI,
                    (QRectF *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      visibilityRequest((QWidgetTextControl *)in_RDI,
                        (QRectF *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    QTextCursor::~QTextCursor((QTextCursor *)&stack0xffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QWidgetTextControl::setFocusToNextOrPreviousAnchor(bool next)
{
    Q_D(QWidgetTextControl);

    if (!(d->interactionFlags & Qt::LinksAccessibleByKeyboard))
        return false;

    QRectF crect = selectionRect();
    emit updateRequest(crect);

    // If we don't have a current anchor, we start from the start/end
    if (!d->cursor.hasSelection()) {
        d->cursor = QTextCursor(d->doc);
        if (next)
            d->cursor.movePosition(QTextCursor::Start);
        else
            d->cursor.movePosition(QTextCursor::End);
    }

    QTextCursor newAnchor;
    if (findNextPrevAnchor(d->cursor, next, newAnchor)) {
        d->cursor = newAnchor;
        d->cursorIsFocusIndicator = true;
    } else {
        d->cursor.clearSelection();
    }

    if (d->cursor.hasSelection()) {
        crect = selectionRect();
        emit updateRequest(crect);
        emit visibilityRequest(crect);
        return true;
    } else {
        return false;
    }
}